

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_reactor.hpp
# Opt level: O0

void __thiscall
boost::asio::detail::epoll_reactor::
schedule_timer<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,boost::asio::wait_traits<std::chrono::_V2::steady_clock>>>
          (epoll_reactor *this,
          timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
          *queue,time_type *time,per_timer_data *timer,wait_op *op)

{
  bool bVar1;
  scheduler *in_RCX;
  long in_RDI;
  operation *in_R8;
  bool earliest;
  scoped_lock lock;
  conditionally_enabled_mutex *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  per_timer_data *in_stack_ffffffffffffffc0;
  time_type *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  
  conditionally_enabled_mutex::scoped_lock::scoped_lock
            ((scoped_lock *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
    bVar1 = timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
            ::enqueue_timer((timer_queue<boost::asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_boost::asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                            in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                            (wait_op *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                           );
    in_stack_ffffffffffffffa7 = bVar1;
    scheduler::work_started((scheduler *)0x140596);
    if (bVar1) {
      update_timeout((epoll_reactor *)in_RCX);
    }
  }
  else {
    scheduler::post_immediate_completion(in_RCX,in_R8,(bool)in_stack_ffffffffffffffd7);
  }
  conditionally_enabled_mutex::scoped_lock::~scoped_lock
            ((scoped_lock *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  return;
}

Assistant:

void epoll_reactor::schedule_timer(timer_queue<Time_Traits>& queue,
    const typename Time_Traits::time_type& time,
    typename timer_queue<Time_Traits>::per_timer_data& timer, wait_op* op)
{
  mutex::scoped_lock lock(mutex_);

  if (shutdown_)
  {
    scheduler_.post_immediate_completion(op, false);
    return;
  }

  bool earliest = queue.enqueue_timer(time, timer, op);
  scheduler_.work_started();
  if (earliest)
    update_timeout();
}